

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>
::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::reset(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
        *this)

{
  bool bVar1;
  long in_RDI;
  BacktrackData *unaff_retaddr;
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>_>
  *in_stack_fffffffffffffff0;
  
  InstanceCntr::reset((InstanceCntr *)(in_RDI + 0xa0));
  Lib::Stack<unsigned_int>::reset((Stack<unsigned_int> *)(in_RDI + 0x10));
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Lhs>::Node_**>_>
  ::reset(in_stack_fffffffffffffff0);
  Lib::Stack<Lib::BacktrackData>::reset((Stack<Lib::BacktrackData> *)(in_RDI + 0x70));
  if ((*(byte *)(in_RDI + 0x90) & 1) != 0) {
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
    ::bdDone((UnificationWithAbstraction<Kernel::AbstractingUnifier_*,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
              *)0xb6b77b);
    *(undefined1 *)(in_RDI + 0x90) = 0;
    Lib::BacktrackData::backtrack(unaff_retaddr);
  }
  while (bVar1 = Lib::Stack<Lib::BacktrackData>::isNonEmpty
                           ((Stack<Lib::BacktrackData> *)(in_RDI + 0x70)), bVar1) {
    Lib::Stack<Lib::BacktrackData>::pop((Stack<Lib::BacktrackData> *)(in_RDI + 0x70));
    Lib::BacktrackData::backtrack(unaff_retaddr);
  }
  Lib::BacktrackData::backtrack(unaff_retaddr);
  return;
}

Assistant:

void reset() {
        _iterCntr.reset();
        _svStack.reset();
        _nodeIterators.reset();
        _bdStack.reset();
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }
        while(_bdStack.isNonEmpty()) {
          _bdStack.pop().backtrack();
        }
        _queryInitBacktrackData.backtrack();
      }